

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCIIRangeFactory.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ASCIIRangeFactory::initializeKeywordMap
          (ASCIIRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  RangeTokenMap *rangeTokMap_local;
  ASCIIRangeFactory *this_local;
  
  if (((this->super_RangeFactory).fKeywordsInitialized & 1U) == 0) {
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgASCIISpace,(XMLCh *)fgASCIICategory);
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgASCIIDigit,(XMLCh *)fgASCIICategory);
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgASCIIWord,(XMLCh *)fgASCIICategory);
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgASCIIXDigit,(XMLCh *)fgASCIICategory);
    RangeTokenMap::addKeywordMap(rangeTokMap,(XMLCh *)fgASCII,(XMLCh *)fgASCIICategory);
    (this->super_RangeFactory).fKeywordsInitialized = true;
  }
  return;
}

Assistant:

void ASCIIRangeFactory::initializeKeywordMap(RangeTokenMap *rangeTokMap) {

    if (fKeywordsInitialized)
        return;

    rangeTokMap->addKeywordMap(fgASCIISpace, fgASCIICategory);
    rangeTokMap->addKeywordMap(fgASCIIDigit, fgASCIICategory);
    rangeTokMap->addKeywordMap(fgASCIIWord, fgASCIICategory);
    rangeTokMap->addKeywordMap(fgASCIIXDigit, fgASCIICategory);
    rangeTokMap->addKeywordMap(fgASCII, fgASCIICategory);

    fKeywordsInitialized = true;
}